

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

FT_Error tt_face_load_post(TT_Face face,FT_Stream stream)

{
  long lVar1;
  FT_Error FVar2;
  
  FVar2 = (*face->goto_table)(face,0x706f7374,stream,(FT_ULong *)0x0);
  if (FVar2 == 0) {
    FVar2 = FT_Stream_ReadFields(stream,tt_face_load_post::post_fields,&face->postscript);
    if (FVar2 == 0) {
      lVar1 = (face->postscript).FormatType;
      if (lVar1 < 0x25000) {
        if ((lVar1 != 0x10000) && (lVar1 != 0x20000)) {
          return 0x9a;
        }
      }
      else if ((lVar1 != 0x30000) && (lVar1 != 0x25000)) {
        return 0x9a;
      }
      FVar2 = 0;
    }
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_post( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error        error;
    TT_Postscript*  post = &face->postscript;

    static const FT_Frame_Field  post_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_Postscript

      FT_FRAME_START( 32 ),
        FT_FRAME_LONG ( FormatType ),
        FT_FRAME_LONG ( italicAngle ),
        FT_FRAME_SHORT( underlinePosition ),
        FT_FRAME_SHORT( underlineThickness ),
        FT_FRAME_ULONG( isFixedPitch ),
        FT_FRAME_ULONG( minMemType42 ),
        FT_FRAME_ULONG( maxMemType42 ),
        FT_FRAME_ULONG( minMemType1 ),
        FT_FRAME_ULONG( maxMemType1 ),
      FT_FRAME_END
    };


    error = face->goto_table( face, TTAG_post, stream, 0 );
    if ( error )
      return error;

    if ( FT_STREAM_READ_FIELDS( post_fields, post ) )
      return error;

    if ( post->FormatType != 0x00030000L &&
         post->FormatType != 0x00025000L &&
         post->FormatType != 0x00020000L &&
         post->FormatType != 0x00010000L )
      return FT_THROW( Invalid_Post_Table_Format );

    /* we don't load the glyph names, we do that in another */
    /* module (ttpost).                                     */

    FT_TRACE3(( "FormatType:   0x%lx\n", post->FormatType ));
    FT_TRACE3(( "isFixedPitch:   %s\n", post->isFixedPitch
                                        ? "  yes" : "   no" ));

    return FT_Err_Ok;
  }